

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindFieldByNumber
          (FileDescriptorTables *this,Descriptor *parent,int number)

{
  first_type *key;
  second_type pFVar1;
  long in_RDI;
  pair<const_google::protobuf::Descriptor_*,_int> pVar2;
  int *in_stack_ffffffffffffffb8;
  
  key = (first_type *)(in_RDI + 200);
  pVar2 = std::make_pair<google::protobuf::Descriptor_const*&,int&>
                    ((Descriptor **)key,in_stack_ffffffffffffffb8);
  pFVar1 = FindPtrOrNull<std::unordered_map<std::pair<google::protobuf::Descriptor_const*,int>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::Descriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::Descriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>>>>
                     ((unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                       *)pVar2.first,key);
  return pFVar1;
}

Assistant:

inline const FieldDescriptor* FileDescriptorTables::FindFieldByNumber(
    const Descriptor* parent, int number) const {
  return FindPtrOrNull(fields_by_number_, std::make_pair(parent, number));
}